

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O2

void __thiscall
Assimp::SMDImporter::ParseNodeInfo(SMDImporter *this,char *szCurrent,char **szCurrentOut)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  char *msg;
  SMDImporter *pSVar5;
  ulong uVar6;
  byte *szCurrent_00;
  pointer pBVar7;
  uint iBone;
  uint local_5c;
  byte *local_58;
  undefined1 local_50 [32];
  
  local_5c = 0;
  pSVar5 = this;
  local_58 = (byte *)szCurrent;
  SkipSpacesAndLineEnd(this,szCurrent,(char **)&local_58);
  bVar3 = ParseUnsignedInt(pSVar5,(char *)local_58,(char **)&local_58,&local_5c);
  if ((bVar3) && (bVar3 = SkipSpaces<char>((char *)local_58,(char **)&local_58), bVar3)) {
    uVar6 = (ulong)local_5c;
    pBVar7 = (this->asBones).
             super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->asBones).
                       super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pBVar7) / 0x90) <= uVar6) {
      std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>::resize
                (&this->asBones,(ulong)(local_5c + 1));
      pBVar7 = (this->asBones).
               super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    bVar1 = *local_58;
    if (bVar1 == 0x22) {
      local_58 = local_58 + 1;
    }
    else {
      LogWarning(this,"Bone name is expcted to be enclosed in double quotation marks. ");
    }
    uVar4 = 0;
    szCurrent_00 = local_58;
    do {
      bVar2 = *szCurrent_00;
      if (bVar1 == 0x22) {
        if (bVar2 == 0) {
          msg = "Unexpected EOF/EOL while parsing bone name";
          goto LAB_005410f7;
        }
        if (bVar2 == 0x22) goto LAB_005411e1;
      }
      else if ((bVar2 < 0x21) && ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) != 0))
      goto LAB_0054117c;
      szCurrent_00 = szCurrent_00 + 1;
      uVar4 = uVar4 + 1;
    } while( true );
  }
  msg = "Unexpected EOF/EOL while parsing bone index";
LAB_005410f7:
  LogErrorNoThrow(this,msg);
LAB_005410ff:
  SkipLine(this,(char *)local_58,(char **)&local_58);
  *szCurrentOut = (char *)local_58;
  return;
LAB_005411e1:
  szCurrent_00 = szCurrent_00 + 1;
LAB_0054117c:
  local_50._0_8_ = local_50 + 0x10;
  pSVar5 = (SMDImporter *)local_50;
  local_5c = uVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)pSVar5,local_58,local_58 + uVar4);
  std::__cxx11::string::operator=((string *)(pBVar7 + uVar6),(string *)pSVar5);
  std::__cxx11::string::~string((string *)pSVar5);
  local_58 = szCurrent_00;
  bVar3 = ParseSignedInt(pSVar5,(char *)szCurrent_00,(char **)&local_58,
                         (int *)&pBVar7[uVar6].iParent);
  if (bVar3) goto LAB_005410ff;
  msg = "Unexpected EOF/EOL while parsing bone parent index. Assuming -1";
  goto LAB_005410f7;
}

Assistant:

void SMDImporter::ParseNodeInfo(const char* szCurrent, const char** szCurrentOut) {
    unsigned int iBone  = 0;
    SkipSpacesAndLineEnd(szCurrent,&szCurrent);
    if ( !ParseUnsignedInt(szCurrent,&szCurrent,iBone) || !SkipSpaces(szCurrent,&szCurrent)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing bone index");
        SMDI_PARSE_RETURN;
    }
    // add our bone to the list
    if (iBone >= asBones.size()) {
        asBones.resize(iBone+1);
    }
    SMD::Bone& bone = asBones[iBone];

    bool bQuota = true;
    if ('\"' != *szCurrent) {
        LogWarning("Bone name is expcted to be enclosed in "
            "double quotation marks. ");
        bQuota = false;
    } else {
        ++szCurrent;
    }

    const char* szEnd = szCurrent;
    for ( ;; ) {
        if (bQuota && '\"' == *szEnd) {
            iBone = (unsigned int)(szEnd - szCurrent);
            ++szEnd;
            break;
        } else if (!bQuota && IsSpaceOrNewLine(*szEnd)) {
            iBone = (unsigned int)(szEnd - szCurrent);
            break;
        } else if (!(*szEnd)) {
            LogErrorNoThrow("Unexpected EOF/EOL while parsing bone name");
            SMDI_PARSE_RETURN;
        }
        ++szEnd;
    }
    bone.mName = std::string(szCurrent,iBone);
    szCurrent = szEnd;

    // the only negative bone parent index that could occur is -1 AFAIK
    if(!ParseSignedInt(szCurrent,&szCurrent,(int&)bone.iParent))  {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing bone parent index. Assuming -1");
        SMDI_PARSE_RETURN;
    }

    // go to the beginning of the next line
    SMDI_PARSE_RETURN;
}